

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O0

CURLcode Curl_uint_bset_resize(uint_bset *bset,uint nmax)

{
  uint uVar1;
  curl_uint64_t *__dest;
  uint local_3c;
  curl_uint64_t *slots;
  uint nslots;
  uint nmax_local;
  uint_bset *bset_local;
  
  uVar1 = nmax + 0x3f >> 6;
  if (uVar1 != bset->nslots) {
    __dest = (curl_uint64_t *)(*Curl_ccalloc)(0,8);
    if (__dest == (curl_uint64_t *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (bset->slots != (curl_uint64_t *)0x0) {
      local_3c = uVar1;
      if (bset->nslots <= uVar1) {
        local_3c = bset->nslots;
      }
      memcpy(__dest,bset->slots,(ulong)local_3c << 3);
      (*Curl_cfree)(bset->slots);
    }
    bset->slots = __dest;
    bset->nslots = uVar1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_uint_bset_resize(struct uint_bset *bset, unsigned int nmax)
{
  unsigned int nslots = (nmax + 63) / 64;

  DEBUGASSERT(bset->init == CURL_UINT_BSET_MAGIC);
  if(nslots != bset->nslots) {
    curl_uint64_t *slots = calloc(nslots, sizeof(curl_uint64_t));
    if(!slots)
      return CURLE_OUT_OF_MEMORY;

    if(bset->slots) {
      memcpy(slots, bset->slots,
             (CURLMIN(nslots, bset->nslots) * sizeof(curl_uint64_t)));
      free(bset->slots);
    }
    bset->slots = slots;
    bset->nslots = nslots;
  }
  return CURLE_OK;
}